

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_frame.c
# Opt level: O0

int dwarf_get_cie_info_b
              (Dwarf_Cie_conflict cie,Dwarf_Unsigned *bytes_in_cie,Dwarf_Small *ptr_to_version,
              char **augmenter,Dwarf_Unsigned *code_alignment_factor,
              Dwarf_Signed *data_alignment_factor,Dwarf_Half *return_address_register,
              Dwarf_Byte_Ptr *initial_instructions,Dwarf_Unsigned *initial_instructions_length,
              Dwarf_Half *offset_size,Dwarf_Error *error)

{
  Dwarf_Debug dbg;
  Dwarf_Signed *data_alignment_factor_local;
  Dwarf_Unsigned *code_alignment_factor_local;
  char **augmenter_local;
  Dwarf_Small *ptr_to_version_local;
  Dwarf_Unsigned *bytes_in_cie_local;
  Dwarf_Cie_conflict cie_local;
  
  if (cie == (Dwarf_Cie_conflict)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x5e);
    cie_local._4_4_ = 1;
  }
  else if ((cie->ci_dbg == (Dwarf_Debug)0x0) || (cie->ci_dbg->de_magic != 0xebfdebfd)) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x5f,
                        "DW_DLE_CIE_DBG_NULL: Either null or it containsa stale Dwarf_Debug pointer"
                       );
    cie_local._4_4_ = 1;
  }
  else {
    if (ptr_to_version != (Dwarf_Small *)0x0) {
      *ptr_to_version = (Dwarf_Small)cie->ci_cie_version_number;
    }
    if (augmenter != (char **)0x0) {
      *augmenter = cie->ci_augmentation;
    }
    if (code_alignment_factor != (Dwarf_Unsigned *)0x0) {
      *code_alignment_factor = cie->ci_code_alignment_factor;
    }
    if (data_alignment_factor != (Dwarf_Signed *)0x0) {
      *data_alignment_factor = cie->ci_data_alignment_factor;
    }
    if (return_address_register != (Dwarf_Half *)0x0) {
      *return_address_register = (Dwarf_Half)cie->ci_return_address_register;
    }
    if (initial_instructions != (Dwarf_Byte_Ptr *)0x0) {
      *initial_instructions = cie->ci_cie_instr_start;
    }
    if (initial_instructions_length != (Dwarf_Unsigned *)0x0) {
      *initial_instructions_length =
           (cie->ci_length + (ulong)cie->ci_length_size + (ulong)cie->ci_extension_size) -
           ((long)cie->ci_cie_instr_start - (long)cie->ci_cie_start);
    }
    if (offset_size != (Dwarf_Half *)0x0) {
      *offset_size = cie->ci_length_size;
    }
    *bytes_in_cie = cie->ci_length;
    cie_local._4_4_ = 0;
  }
  return cie_local._4_4_;
}

Assistant:

int
dwarf_get_cie_info_b(Dwarf_Cie cie,
    Dwarf_Unsigned *bytes_in_cie,
    Dwarf_Small    *ptr_to_version,
    char          **augmenter,
    Dwarf_Unsigned *code_alignment_factor,
    Dwarf_Signed   *data_alignment_factor,
    Dwarf_Half     *return_address_register,
    Dwarf_Byte_Ptr      *initial_instructions,
    Dwarf_Unsigned *initial_instructions_length,
    Dwarf_Half     *offset_size,
    Dwarf_Error    *error)
{
    Dwarf_Debug dbg = 0;

    if (!cie) {
        _dwarf_error(NULL, error, DW_DLE_CIE_NULL);
        return DW_DLV_ERROR;
    }
    dbg = cie->ci_dbg;
    if (IS_INVALID_DBG(dbg)) {
        _dwarf_error_string(NULL, error, DW_DLE_CIE_DBG_NULL,
            "DW_DLE_CIE_DBG_NULL: Either null or it contains"
            "a stale Dwarf_Debug pointer");
        return DW_DLV_ERROR;
    }
    if (ptr_to_version != NULL)
        *ptr_to_version =
            (Dwarf_Small)cie->ci_cie_version_number;
    if (augmenter != NULL)
        *augmenter = cie->ci_augmentation;
    if (code_alignment_factor != NULL)
        *code_alignment_factor = cie->ci_code_alignment_factor;
    if (data_alignment_factor != NULL)
        *data_alignment_factor = cie->ci_data_alignment_factor;
    if (return_address_register != NULL)
        *return_address_register =
            (Dwarf_Half)cie->ci_return_address_register;
    if (initial_instructions != NULL)
        *initial_instructions = cie->ci_cie_instr_start;
    if (initial_instructions_length != NULL) {
        *initial_instructions_length = cie->ci_length +
            cie->ci_length_size +
            cie->ci_extension_size -
            (cie->ci_cie_instr_start - cie->ci_cie_start);
    }
    if (offset_size) {
        *offset_size = cie->ci_length_size;
    }
    *bytes_in_cie = (cie->ci_length);
    return DW_DLV_OK;
}